

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O0

RSDoublelinCameraPose * outputSwitchDirection<RSDoublelinCameraPose>(RSDoublelinCameraPose *in)

{
  double dVar1;
  CoeffReturnType pdVar2;
  DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *this;
  Scalar *pSVar3;
  long in_RSI;
  RSDoublelinCameraPose *in_RDI;
  RSDoublelinCameraPose *out;
  Index in_stack_ffffffffffffff78;
  RSDoublelinCameraPose *in_stack_ffffffffffffff80;
  
  RSDoublelinCameraPose::RSDoublelinCameraPose(in_stack_ffffffffffffff80);
  pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> *)
                      in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  this = (DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
         ((ulong)*pdVar2 ^ 0x8000000000000000);
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator()
                     (this,in_stack_ffffffffffffff78);
  *pSVar3 = (Scalar)this;
  pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> *)this,
                      in_stack_ffffffffffffff78);
  dVar1 = *pdVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator()
                     (this,in_stack_ffffffffffffff78);
  *pSVar3 = -dVar1;
  pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> *)this,
                      in_stack_ffffffffffffff78);
  dVar1 = *pdVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator()
                     (this,in_stack_ffffffffffffff78);
  *pSVar3 = -dVar1;
  pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> *)this,
                      in_stack_ffffffffffffff78);
  dVar1 = *pdVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator()
                     (this,in_stack_ffffffffffffff78);
  *pSVar3 = -dVar1;
  pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> *)this,
                      in_stack_ffffffffffffff78);
  dVar1 = *pdVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator()
                     (this,in_stack_ffffffffffffff78);
  *pSVar3 = -dVar1;
  pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> *)this,
                      in_stack_ffffffffffffff78);
  dVar1 = *pdVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator()
                     (this,in_stack_ffffffffffffff78);
  *pSVar3 = -dVar1;
  pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> *)this,
                      in_stack_ffffffffffffff78);
  dVar1 = *pdVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator()
                     (this,in_stack_ffffffffffffff78);
  *pSVar3 = dVar1;
  pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> *)this,
                      in_stack_ffffffffffffff78);
  dVar1 = *pdVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator()
                     (this,in_stack_ffffffffffffff78);
  *pSVar3 = dVar1;
  pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> *)this,
                      in_stack_ffffffffffffff78);
  dVar1 = *pdVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator()
                     (this,in_stack_ffffffffffffff78);
  *pSVar3 = dVar1;
  pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> *)this,
                      in_stack_ffffffffffffff78);
  dVar1 = *pdVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator()
                     (this,in_stack_ffffffffffffff78);
  *pSVar3 = dVar1;
  pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> *)this,
                      in_stack_ffffffffffffff78);
  dVar1 = *pdVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator()
                     (this,in_stack_ffffffffffffff78);
  *pSVar3 = dVar1;
  pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> *)this,
                      in_stack_ffffffffffffff78);
  dVar1 = *pdVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator()
                     (this,in_stack_ffffffffffffff78);
  *pSVar3 = dVar1;
  in_RDI->f = *(double *)(in_RSI + 0x60);
  in_RDI->rd = *(double *)(in_RSI + 0x68);
  return in_RDI;
}

Assistant:

T outputSwitchDirection(const T & in){
	T out;
	out.v(0) = - in.v(1);
	out.v(1) = - in.v(0);
	out.v(2) = - in.v(2);
	out.w(0) = - in.w(1);
	out.w(1) = - in.w(0);
	out.w(2) = - in.w(2);
	out.C(0) = in.C(1);
	out.C(1) = in.C(0);
	out.C(2) = in.C(2);
	out.t(0) = in.t(1);
	out.t(1) = in.t(0);
	out.t(2) = in.t(2);	
	out.f = in.f;
	out.rd = in.rd;

	return out;
}